

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Primitive.cpp
# Opt level: O2

void __thiscall Primitive::input(Primitive *this,string *var,stringstream *fin)

{
  bool bVar1;
  string file;
  string local_78 [96];
  
  bVar1 = std::operator==(var,"color=");
  if (bVar1) {
    operator>>(fin,&this->color);
  }
  bVar1 = std::operator==(var,"absor=");
  if (bVar1) {
    operator>>(fin,&this->absor);
  }
  bVar1 = std::operator==(var,"refl=");
  if (bVar1) {
    std::istream::_M_extract<double>((double *)fin);
  }
  bVar1 = std::operator==(var,"refr=");
  if (bVar1) {
    std::istream::_M_extract<double>((double *)fin);
  }
  bVar1 = std::operator==(var,"diff=");
  if (bVar1) {
    std::istream::_M_extract<double>((double *)fin);
  }
  bVar1 = std::operator==(var,"spec=");
  if (bVar1) {
    std::istream::_M_extract<double>((double *)fin);
  }
  bVar1 = std::operator==(var,"rindex=");
  if (bVar1) {
    std::istream::_M_extract<double>((double *)fin);
  }
  bVar1 = std::operator==(var,"texture=");
  if (bVar1) {
    file._M_dataplus._M_p = (pointer)&file.field_2;
    file._M_string_length = 0;
    file.field_2._M_local_buf[0] = '\0';
    std::operator>>((istream *)fin,(string *)&file);
    cv::imread(local_78,(int)&file);
    Picture::operator=(&this->texture,(Mat *)local_78);
    cv::Mat::~Mat((Mat *)local_78);
    if ((this->texture).data == (Vec3b *)0x0) {
      __assert_fail("texture.data != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/lazycal[P]Progressive-Photon-Mapping/Primitive.cpp"
                    ,0x12,"virtual void Primitive::input(const std::string &, std::stringstream &)")
      ;
    }
    std::__cxx11::string::~string((string *)&file);
  }
  return;
}

Assistant:

void Primitive::input(const std::string &var, std::stringstream &fin) {
    if ( var == "color=" ) fin >> color;
    if ( var == "absor=" ) fin >> absor;
    if ( var == "refl=" ) fin >> refl;
    if ( var == "refr=" ) fin >> refr;
    if ( var == "diff=" ) fin >> diff;
    if ( var == "spec=" ) fin >> spec;
    if ( var == "rindex=" ) fin >> rindex;
    if ( var == "texture=" ) {
        std::string file; fin >> file;
        texture = imread(file);
        assert(texture.data != NULL);
    }
}